

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

bool tinyusdz::LoadUSDAFromMemory
               (uint8_t *addr,size_t length,string *base_dir,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  bool bVar1;
  ssize_t sVar2;
  long *plVar3;
  Stage *pSVar4;
  size_type *psVar5;
  char *pcVar6;
  char *pcVar7;
  USDAReaderConfig config;
  StreamReader sr;
  USDAReader local_a0;
  string local_98;
  USDAReaderConfig local_74;
  string local_70;
  StreamReader local_50;
  
  if (addr == (uint8_t *)0x0) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar7 = (char *)err->_M_string_length;
    pcVar6 = "null pointer for `addr` argument.\n";
LAB_0012ba0f:
    ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar7,(ulong)pcVar6);
    return false;
  }
  if (stage == (Stage *)0x0) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar7 = (char *)err->_M_string_length;
    pcVar6 = "null pointer for `stage` argument.\n";
    goto LAB_0012ba0f;
  }
  local_50.swap_endian_ = false;
  local_50.idx_ = 0;
  pSVar4 = stage;
  local_50.binary_ = addr;
  local_50.length_ = length;
  usda::USDAReader::USDAReader(&local_a0,&local_50);
  local_74 = (USDAReaderConfig)
             (CONCAT13(options->strict_allowedToken_check,
                       CONCAT12(options->strict_apiSchema_check,0x101)) ^ 0x10000);
  usda::USDAReader::set_reader_config(&local_a0,&local_74);
  usda::USDAReader::set_base_dir(&local_a0,(string *)base_dir);
  sVar2 = usda::USDAReader::read(&local_a0,1,(void *)0x0,(size_t)pSVar4);
  if ((char)sVar2 == '\0') {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
      usda::USDAReader::get_error_abi_cxx11_(&local_98,&local_a0);
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
LAB_0012bba0:
    bVar1 = false;
  }
  else {
    bVar1 = usda::USDAReader::reconstruct_stage(&local_a0);
    if (!bVar1) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::append((char *)err);
        usda::USDAReader::get_error_abi_cxx11_(&local_70,&local_a0);
        plVar3 = (long *)::std::__cxx11::string::append((char *)&local_70);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_98.field_2._M_allocated_capacity = *psVar5;
          local_98.field_2._8_8_ = plVar3[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar5;
          local_98._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_98._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_98._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar1) goto LAB_0012bba0;
    }
    pSVar4 = usda::USDAReader::get_stage(&local_a0);
    std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator=
              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)stage,
               (vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pSVar4);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stage->_root_node_nameSet,&(pSVar4->_root_node_nameSet)._M_t);
    ::std::__cxx11::string::_M_assign((string *)&stage->name);
    stage->default_root_node = pSVar4->default_root_node;
    LayerMetas::operator=(&stage->stage_metas,&pSVar4->stage_metas);
    ::std::__cxx11::string::_M_assign((string *)&stage->_err);
    ::std::__cxx11::string::_M_assign((string *)&stage->_warn);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 *)&stage->_prim_path_cache,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 *)&pSVar4->_prim_path_cache);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
    ::operator=((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
                 *)&stage->_prim_id_cache,
                (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
                 *)&pSVar4->_prim_id_cache);
    bVar1 = pSVar4->_prim_id_dirty;
    stage->_dirty = pSVar4->_dirty;
    stage->_prim_id_dirty = bVar1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stage->_prim_id_allocator,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pSVar4->_prim_id_allocator)
    ;
    (stage->_prim_id_allocator).counter_ = (pSVar4->_prim_id_allocator).counter_;
    (stage->_prim_id_allocator).dirty_ = (pSVar4->_prim_id_allocator).dirty_;
    bVar1 = true;
    if (warn != (string *)0x0) {
      usda::USDAReader::get_warning_abi_cxx11_(&local_98,&local_a0);
      ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
  }
  usda::USDAReader::~USDAReader(&local_a0);
  return bVar1;
}

Assistant:

bool LoadUSDAFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &base_dir, Stage *stage,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  if (addr == nullptr) {
    if (err) {
      (*err) = "null pointer for `addr` argument.\n";
    }
    return false;
  }

  if (stage == nullptr) {
    if (err) {
      (*err) = "null pointer for `stage` argument.\n";
    }
    return false;
  }

  tinyusdz::StreamReader sr(addr, length, /* swap endian */ false);
  tinyusdz::usda::USDAReader reader(&sr);

  tinyusdz::usda::USDAReaderConfig config;
  config.strict_allowedToken_check = options.strict_allowedToken_check;
  config.allow_unknown_apiSchema = !options.strict_apiSchema_check;
  reader.set_reader_config(config);

  reader.SetBaseDir(base_dir);

  {
    bool ret = reader.Read();

    if (!ret) {
      if (err) {
        (*err) += "Failed to parse USDA\n";
        (*err) += reader.GetError();
      }

      return false;
    }
  }

  {
    bool ret = reader.ReconstructStage();
    if (!ret) {
      if (err) {
        (*err) += "Failed to reconstruct Stage from USDA:\n";
        (*err) += reader.GetError() + "\n";
      }
      return false;
    }
  }

  (*stage) = reader.GetStage();

  if (warn) {
    (*warn) += reader.GetWarning();
  }

  return true;
}